

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<false,_true,_false>::is_target_ex_
          (DaTrie<false,_true,_false> *this,uint32_t base,Edge *edge)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  byte *pbVar4;
  byte *upper;
  const_reference pvVar5;
  size_t sVar6;
  Edge *in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t node_pos;
  uint32_t child_pos;
  uint8_t label;
  uint8_t *__end2;
  uint8_t *__begin2;
  Edge *__range2;
  Edge *this_00;
  
  sVar3 = Edge::size(in_RDX);
  if (sVar3 == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3c3,
                  "bool ddd::DaTrie<false, true, false>::is_target_ex_(uint32_t, const Edge &) const [WithBLM = false, WithNLM = true, Prefix = false]"
                 );
  }
  this_00 = in_RDX;
  pbVar4 = Edge::begin(in_RDX);
  upper = Edge::end(this_00);
  while( true ) {
    if (pbVar4 == upper) {
      return true;
    }
    uVar2 = in_ESI ^ *pbVar4;
    if (uVar2 == 0) break;
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
    bVar1 = Bc::is_fixed(pvVar5);
    if (bVar1) {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
      Bc::check(pvVar5);
      sVar3 = Edge::size(in_RDX);
      Edge::size(in_RDX);
      sVar6 = edge_size_((DaTrie<false,_true,_false> *)this_00,(uint32_t)((ulong)pbVar4 >> 0x20),
                         (size_t)upper);
      if (sVar3 <= sVar6) {
        return false;
      }
    }
    pbVar4 = pbVar4 + 1;
  }
  return false;
}

Assistant:

bool is_target_ex_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (child_pos == ROOT_POS) {
        return false;
      }
      if (bc_[child_pos].is_fixed()) {
        auto node_pos = bc_[child_pos].check();
        if (edge.size() <= edge_size_(node_pos, edge.size())) {
          return false;
        }
      }
    }
    return true;
  }